

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.hpp
# Opt level: O2

void __thiscall
tl::Vector<glm::vec<3,float,(glm::qualifier)0>>::emplace_back<float,int,int>
          (Vector<glm::vec<3,float,(glm::qualifier)0>> *this,float *args,int *args_1,int *args_2)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  
  lVar4 = *(long *)(this + 8);
  if (lVar4 == *(long *)(this + 0x10)) {
    Vector<glm::vec<3,_float,_(glm::qualifier)0>_>::grow
              ((Vector<glm::vec<3,_float,_(glm::qualifier)0>_> *)this,lVar4 + 1);
    lVar4 = *(long *)(this + 8);
  }
  lVar3 = *(long *)this;
  iVar1 = *args_2;
  iVar2 = *args_1;
  *(float *)(lVar3 + lVar4 * 0xc) = *args;
  *(ulong *)(lVar3 + 4 + lVar4 * 0xc) = CONCAT44((float)iVar1,(float)iVar2);
  *(long *)(this + 8) = *(long *)(this + 8) + 1;
  return;
}

Assistant:

void Vector<T>::emplace_back(Args&&... args)noexcept
{
    if(_size == _capacity)
        grow(_capacity+1);
    new ((void*)&_data[_size]) T(tl::forward<Args>(args)...);
    _size++;
}